

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::InitializeDiskSourceTree
          (CommandLineInterface *this,DiskSourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  ssize_t sVar4;
  pointer ppVar5;
  AlphaNum *b;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar6;
  AlphaNum *pAVar7;
  CommandLineInterface *this_00;
  long lVar8;
  string *proto;
  ulong uVar9;
  string_view path;
  string_view path_00;
  string_view path_01;
  string_view virtual_path;
  string_view disk_path;
  string include_path;
  string path_str;
  char buffer [4096];
  basic_string_view<char,_std::char_traits<char>_> local_10d8;
  string local_10c8;
  CommandLineInterface *local_10a8;
  AlphaNum *local_10a0;
  undefined1 local_1098 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1088;
  _Alloc_hider local_1078;
  undefined1 local_1068 [48];
  AlphaNum *local_1038;
  HeapOrSoo aHStack_1030 [256];
  
  local_10a0 = (AlphaNum *)0x0;
  local_1098[0] = 0;
  local_10a8 = (CommandLineInterface *)local_1098;
  sVar4 = readlink("/proc/self/exe",(char *)&local_1038,0x1000);
  if ((int)sVar4 < 1) goto LAB_001d5514;
  std::__cxx11::string::_M_replace((ulong)&local_10a8,0,(char *)local_10a0,(ulong)&local_1038);
  local_10d8._M_len = (size_t)local_10a0;
  local_10d8._M_str = (char *)local_10a8;
  pAVar7 = local_10a0;
  while (pAVar7 != (AlphaNum *)0x0) {
    pAVar7 = (AlphaNum *)(pAVar7[-1].digits_ + 0x1f);
    if ((pAVar7->digits_
         [(long)(&local_10a8[-1].dependency_out_name_.field_2._M_allocated_capacity + 1)] == '/') ||
       (pAVar7->digits_
        [(long)(&local_10a8[-1].dependency_out_name_.field_2._M_allocated_capacity + 1)] == '\\'))
    goto LAB_001d53a9;
  }
  pAVar7 = (AlphaNum *)0xffffffffffffffff;
LAB_001d53a9:
  b = (AlphaNum *)((long)&(pAVar7->piece_)._M_len + 1);
  if (b < (AlphaNum *)0x2) goto LAB_001d5514;
  local_10d8._M_len = (size_t)pAVar7;
  if (local_10a0 < pAVar7) {
    local_10d8._M_len = (size_t)local_10a0;
  }
  path._M_str = extraout_RDX;
  path._M_len = (size_t)local_10a8;
  bVar2 = anon_unknown_5::IsInstalledProtoPath((anon_unknown_5 *)local_10d8._M_len,path);
  if (bVar2) {
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[1],std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,(char (*) [1])0x3c672c,&local_10d8);
    goto LAB_001d5514;
  }
  local_1038 = (AlphaNum *)local_10d8._M_len;
  aHStack_1030[0].heap.control = local_10d8._M_str;
  local_1068._0_8_ = 8;
  local_1068._8_8_ = "/include";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_10c8,(lts_20250127 *)&local_1038,(AlphaNum *)local_1068,b);
  path_00._M_str = extraout_RDX_00;
  path_00._M_len = (size_t)local_10c8._M_dataplus._M_p;
  bVar2 = anon_unknown_5::IsInstalledProtoPath
                    ((anon_unknown_5 *)local_10c8._M_string_length,path_00);
  pAVar7 = (AlphaNum *)local_10d8._M_len;
  if (bVar2) {
LAB_001d542c:
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[1],std::__cxx11::string>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,(char (*) [1])0x3c672c,&local_10c8);
  }
  else {
    while (pAVar7 != (AlphaNum *)0x0) {
      pAVar7 = (AlphaNum *)(pAVar7[-1].digits_ + 0x1f);
      if ((pAVar7->digits_
           [(long)(&(((CommandLineInterface *)((long)local_10d8._M_str + -0x240))->
                    dependency_out_name_).field_2._M_allocated_capacity + 1)] == '/') ||
         (pAVar7->digits_
          [(long)(&(((CommandLineInterface *)((long)local_10d8._M_str + -0x240))->
                   dependency_out_name_).field_2._M_allocated_capacity + 1)] == '\\'))
      goto LAB_001d5472;
    }
    pAVar7 = (AlphaNum *)0xffffffffffffffff;
LAB_001d5472:
    if ((undefined1 *)0x1 < (undefined1 *)((long)&(pAVar7->piece_)._M_len + 1U)) {
      local_1038 = pAVar7;
      if (local_10d8._M_len < pAVar7) {
        local_1038 = (AlphaNum *)local_10d8._M_len;
      }
      aHStack_1030[0].heap.control = local_10d8._M_str;
      local_1068._0_8_ = 8;
      local_1068._8_8_ = "/include";
      local_10d8._M_len = (size_t)local_1038;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_1098 + 0x10),(lts_20250127 *)&local_1038,(AlphaNum *)local_1068,
                 local_1038);
      std::__cxx11::string::operator=((string *)&local_10c8,(string *)(local_1098 + 0x10));
      pcVar6 = extraout_RDX_01;
      if ((undefined1 *)local_1088._M_allocated_capacity != local_1098 + 0x20) {
        operator_delete((void *)local_1088._M_allocated_capacity,(ulong)(local_1078._M_p + 1));
        pcVar6 = extraout_RDX_02;
      }
      path_01._M_str = pcVar6;
      path_01._M_len = (size_t)local_10c8._M_dataplus._M_p;
      bVar2 = anon_unknown_5::IsInstalledProtoPath
                        ((anon_unknown_5 *)local_10c8._M_string_length,path_01);
      if (bVar2) goto LAB_001d542c;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10c8._M_dataplus._M_p != &local_10c8.field_2) {
    operator_delete(local_10c8._M_dataplus._M_p,local_10c8.field_2._M_allocated_capacity + 1);
  }
LAB_001d5514:
  this_00 = local_10a8;
  if (local_10a8 != (CommandLineInterface *)local_1098) {
    operator_delete(local_10a8,CONCAT71(local_1098._1_7_,local_1098[0]) + 1);
  }
  ppVar5 = (this->proto_path_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    lVar8 = 0x28;
    uVar9 = 0;
    do {
      virtual_path._M_str = *(char **)((long)ppVar5 + lVar8 + -0x28);
      virtual_path._M_len = *(size_t *)((long)ppVar5 + lVar8 + -0x20);
      disk_path._M_str = *(char **)((long)ppVar5 + lVar8 + -8);
      disk_path._M_len = *(size_t *)((long)&(ppVar5->first)._M_dataplus._M_p + lVar8);
      this_00 = (CommandLineInterface *)source_tree;
      DiskSourceTree::MapPath(source_tree,virtual_path,disk_path);
      uVar9 = uVar9 + 1;
      ppVar5 = (this->proto_path_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x40;
    } while (uVar9 < (ulong)((long)(this->proto_path_).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 6));
  }
  proto = (this->input_files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = proto == psVar1;
  if ((!bVar2) &&
     (bVar3 = MakeProtoProtoPathRelative(this_00,source_tree,proto,fallback_database), bVar3)) {
    do {
      proto = proto + 1;
      bVar2 = proto == psVar1;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = MakeProtoProtoPathRelative(this_00,source_tree,proto,fallback_database);
    } while (bVar3);
  }
  return bVar2;
}

Assistant:

bool CommandLineInterface::InitializeDiskSourceTree(
    DiskSourceTree* source_tree, DescriptorDatabase* fallback_database) {
  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  for (size_t i = 0; i < proto_path_.size(); ++i) {
    source_tree->MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if possible.
  if (!MakeInputsBeProtoPathRelative(source_tree, fallback_database)) {
    return false;
  }

  return true;
}